

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromInterval(double sharpness0,double sharpness1)

{
  ON_SubDEdgeSharpness OVar1;
  double dVar2;
  double dVar3;
  ON_SubDEdgeSharpness *pOVar4;
  
  if ((((0.0 <= sharpness0) && (sharpness1 <= 4.0)) && (0.0 <= sharpness1)) && (sharpness0 <= 4.0))
  {
    dVar2 = Sanitize(sharpness0,0.0);
    dVar3 = Sanitize(sharpness1,0.0);
    OVar1.m_edge_sharpness[1] = (float)dVar3;
    OVar1.m_edge_sharpness[0] = (float)dVar2;
    return (ON_SubDEdgeSharpness)OVar1.m_edge_sharpness;
  }
  if (((sharpness0 != 5.0) || (sharpness1 != 5.0)) || (NAN(sharpness1))) {
    pOVar4 = &Nan;
  }
  else {
    pOVar4 = &Crease;
  }
  return (ON_SubDEdgeSharpness)*&pOVar4->m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromInterval(
  double sharpness0,
  double sharpness1
)
{
  if (sharpness0 >= 0.0 && sharpness0 <= ON_SubDEdgeSharpness::MaximumValue 
    && sharpness1 >= 0.0 && sharpness1 <= ON_SubDEdgeSharpness::MaximumValue)
  {
    ON_SubDEdgeSharpness s;
    s.m_edge_sharpness[0] = (float)ON_SubDEdgeSharpness::Sanitize(sharpness0, 0.0);
    s.m_edge_sharpness[1] = (float)ON_SubDEdgeSharpness::Sanitize(sharpness1, 0.0);
    return s;
  }
  
  if (ON_SubDEdgeSharpness::CreaseValue == sharpness0 && ON_SubDEdgeSharpness::CreaseValue == sharpness1)
  {
    return ON_SubDEdgeSharpness::Crease;
  }

  return ON_SubDEdgeSharpness::Nan;
}